

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

void __thiscall S2Polygon::InitLoopProperties(S2Polygon *this)

{
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> _Var1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  S2LatLngRect local_80;
  S2LatLngRect local_58;
  
  this->num_vertices_ = 0;
  (this->bound_).lat_.bounds_.c_[0] = 1.0;
  (this->bound_).lat_.bounds_.c_[1] = 0.0;
  (this->bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  puVar3 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->loops_).
                              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 3)) {
    lVar4 = 0;
    do {
      if (*(int *)((long)puVar3[lVar4]._M_t.
                         super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t + 8) == 0)
      {
        _Var1._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
        super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
             puVar3[lVar4]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
        local_80.super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002c2078;
        local_80.lat_.bounds_.c_[0] =
             *(VType *)((long)_Var1._M_t.
                              super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                              super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x28);
        local_80.lat_.bounds_.c_[1] =
             *(VType *)((long)_Var1._M_t.
                              super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                              super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x30);
        local_80.lng_.bounds_.c_[0] =
             *(VType *)((long)_Var1._M_t.
                              super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                              super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x38);
        local_80.lng_.bounds_.c_[1] =
             *(VType *)((long)_Var1._M_t.
                              super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                              super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x40);
        S2LatLngRect::Union(&local_58,&this->bound_,&local_80);
        (this->bound_).lng_.bounds_.c_[0] = local_58.lng_.bounds_.c_[0];
        (this->bound_).lng_.bounds_.c_[1] = local_58.lng_.bounds_.c_[1];
        (this->bound_).lat_.bounds_.c_[0] = local_58.lat_.bounds_.c_[0];
        (this->bound_).lat_.bounds_.c_[1] = local_58.lat_.bounds_.c_[1];
      }
      puVar3 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this->num_vertices_ =
           this->num_vertices_ +
           *(int *)((long)puVar3[lVar4]._M_t.
                          super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t + 0xc);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)((ulong)((long)puVar2 - (long)puVar3) >> 3));
  }
  S2LatLngRectBounder::ExpandForSubregions(&local_58,&this->bound_);
  (this->subregion_bound_).lng_.bounds_.c_[0] = local_58.lng_.bounds_.c_[0];
  (this->subregion_bound_).lng_.bounds_.c_[1] = local_58.lng_.bounds_.c_[1];
  (this->subregion_bound_).lat_.bounds_.c_[0] = local_58.lat_.bounds_.c_[0];
  (this->subregion_bound_).lat_.bounds_.c_[1] = local_58.lat_.bounds_.c_[1];
  InitIndex(this);
  return;
}

Assistant:

void S2Polygon::InitLoopProperties() {
  num_vertices_ = 0;
  bound_ = S2LatLngRect::Empty();
  for (int i = 0; i < num_loops(); ++i) {
    if (loop(i)->depth() == 0) {
      bound_ = bound_.Union(loop(i)->GetRectBound());
    }
    num_vertices_ += loop(i)->num_vertices();
  }
  subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);
  InitIndex();
}